

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kLiveConstraints.c
# Opt level: O2

Vec_Ptr_t * gatherMonotoneSignals(Aig_Man_t *pAig)

{
  Aig_Obj_t *pObj;
  int i;
  
  for (i = 0; i < pAig->vObjs->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,i);
    if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
      Aig_ObjPrint(pAig,pObj);
      putchar(10);
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *gatherMonotoneSignals(Aig_Man_t *pAig)
{
	int i;
	Aig_Obj_t *pObj;

	Aig_ManForEachNode( pAig, pObj, i )
	{
		Aig_ObjPrint( pAig, pObj );
		printf("\n");
	}
	
	return NULL;
}